

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pager_end_transaction(Pager *pPager,int hasSuper,int bCommit)

{
  u8 uVar1;
  sqlite3_file *psVar2;
  sqlite3_io_methods *psVar3;
  sqlite3_io_methods *psVar4;
  long lVar5;
  _func_int_sqlite3_vfs_ptr_char_ptr_int *p_Var6;
  Wal *pWVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long in_RAX;
  PgHdr *pPVar11;
  MemJournal *p;
  PCache *pCache;
  bool bVar12;
  long local_38;
  
  if ((pPager->eState < 2) && (pPager->eLock < 2)) {
    return 0;
  }
  local_38 = in_RAX;
  releaseAllSavepoints(pPager);
  psVar2 = pPager->jfd;
  psVar3 = psVar2->pMethods;
  iVar9 = 0;
  iVar8 = 0;
  if (psVar3 != (sqlite3_io_methods *)0x0) {
    iVar8 = iVar9;
    if (psVar3 == &MemJournalMethods) {
      psVar3 = psVar2[2].pMethods;
      while (psVar3 != (sqlite3_io_methods *)0x0) {
        psVar4 = *(sqlite3_io_methods **)psVar3;
        sqlite3_free(psVar3);
        psVar3 = psVar4;
      }
      psVar2->pMethods = (sqlite3_io_methods *)0x0;
    }
    else {
      uVar1 = pPager->journalMode;
      if (uVar1 == '\x01') {
LAB_0012e469:
        bVar12 = true;
        if (hasSuper == 0) {
          bVar12 = pPager->tempFile != '\0';
        }
        if (pPager->journalOff == 0) {
LAB_0012e49c:
          iVar8 = 0;
        }
        else {
          lVar5 = pPager->journalSizeLimit;
          if ((bool)(bVar12 | lVar5 == 0)) {
            iVar8 = (*psVar3->xTruncate)(psVar2,0);
          }
          else {
            iVar8 = (*psVar3->xWrite)(psVar2,zeroJournalHdr_zeroHdr,0x1c,0);
          }
          if (iVar8 == 0) {
            iVar8 = 0;
            if (pPager->noSync == '\0') {
              iVar8 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,pPager->syncFlags | 0x10);
            }
            if (((0 < lVar5 && iVar8 == 0) &&
                (iVar8 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,&local_38), iVar8 == 0)) &&
               (iVar8 = 0, lVar5 < local_38)) {
              iVar8 = (*pPager->jfd->pMethods->xTruncate)(pPager->jfd,lVar5);
            }
          }
        }
      }
      else {
        if (uVar1 != '\x03') {
          if ((uVar1 == '\x05') || (pPager->exclusiveMode == '\0')) {
            uVar1 = pPager->tempFile;
            (*psVar3->xClose)(psVar2);
            psVar2->pMethods = (sqlite3_io_methods *)0x0;
            if (uVar1 == '\0') {
              p_Var6 = pPager->pVfs->xDelete;
              if (p_Var6 != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
                iVar8 = (*p_Var6)(pPager->pVfs,pPager->zJournal,(uint)pPager->extraSync);
              }
            }
            goto LAB_0012e564;
          }
          goto LAB_0012e469;
        }
        if (pPager->journalOff == 0) goto LAB_0012e49c;
        iVar8 = (*psVar3->xTruncate)(psVar2,0);
        if (iVar8 == 0) {
          if (pPager->fullSync == '\0') goto LAB_0012e49c;
          iVar8 = 0;
          if (pPager->syncFlags != 0) {
            iVar8 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,(uint)pPager->syncFlags);
          }
        }
      }
      pPager->journalOff = 0;
    }
  }
LAB_0012e564:
  sqlite3BitvecDestroy(pPager->pInJournal);
  pPager->pInJournal = (Bitvec *)0x0;
  pPager->nRec = 0;
  if (iVar8 == 0) {
    if ((pPager->memDb == '\0') && (iVar9 = pagerFlushOnCommit(pPager,bCommit), iVar9 == 0)) {
      pCache = pPager->pPCache;
      for (pPVar11 = pCache->pDirty; pPVar11 != (PgHdr *)0x0; pPVar11 = pPVar11->pDirtyNext) {
        *(byte *)&pPVar11->flags = (byte)pPVar11->flags & 0xf3;
      }
      pCache->pSynced = pCache->pDirtyTail;
    }
    else {
      pCache = pPager->pPCache;
      pPVar11 = pCache->pDirty;
      if (pPVar11 != (PgHdr *)0x0) {
        do {
          sqlite3PcacheMakeClean(pPVar11);
          pPVar11 = pCache->pDirty;
        } while (pPVar11 != (PgHdr *)0x0);
        pCache = pPager->pPCache;
      }
    }
    sqlite3PcacheTruncate(pCache,pPager->dbSize);
  }
  if (pPager->pWal == (Wal *)0x0) {
    if ((bCommit != 0) && (iVar8 == 0)) {
      iVar8 = 0;
      if (pPager->dbSize < pPager->dbFileSize) {
        iVar8 = pager_truncate(pPager,pPager->dbSize);
      }
    }
  }
  else {
    sqlite3WalEndWriteTransaction(pPager->pWal);
  }
  if ((bCommit != 0) && (iVar8 == 0)) {
    psVar3 = pPager->fd->pMethods;
    if ((psVar3 == (sqlite3_io_methods *)0x0) ||
       (iVar8 = (*psVar3->xFileControl)(pPager->fd,0x16,(void *)0x0), iVar8 == 0xc)) {
      iVar8 = 0;
    }
  }
  iVar10 = 0;
  iVar9 = 0;
  if (pPager->exclusiveMode != '\0') goto LAB_0012e6e2;
  pWVar7 = pPager->pWal;
  if (pWVar7 != (Wal *)0x0) {
    iVar9 = iVar10;
    if (pWVar7->exclusiveMode == '\0') goto LAB_0012e6e2;
    pWVar7->exclusiveMode = '\0';
    iVar10 = (*pWVar7->pDbFd->pMethods->xShmLock)(pWVar7->pDbFd,pWVar7->readLock + 3,1,6);
    if (iVar10 != 0) {
      pWVar7->exclusiveMode = '\x01';
      goto LAB_0012e6e2;
    }
    if (pWVar7->exclusiveMode != '\0') goto LAB_0012e6e2;
  }
  psVar3 = pPager->fd->pMethods;
  iVar9 = 0;
  if (psVar3 != (sqlite3_io_methods *)0x0) {
    if (pPager->noLock == '\0') {
      iVar9 = (*psVar3->xUnlock)(pPager->fd,1);
    }
    if (pPager->eLock != '\x05') {
      pPager->eLock = '\x01';
    }
  }
  pPager->changeCountDone = pPager->tempFile;
LAB_0012e6e2:
  pPager->eState = '\x01';
  pPager->setSuper = '\0';
  if (iVar8 != 0) {
    iVar9 = iVar8;
  }
  return iVar9;
}

Assistant:

static int pager_end_transaction(Pager *pPager, int hasSuper, int bCommit){
  int rc = SQLITE_OK;      /* Error code from journal finalization operation */
  int rc2 = SQLITE_OK;     /* Error code from db file unlock operation */

  /* Do nothing if the pager does not have an open write transaction
  ** or at least a RESERVED lock. This function may be called when there
  ** is no write-transaction active but a RESERVED or greater lock is
  ** held under two circumstances:
  **
  **   1. After a successful hot-journal rollback, it is called with
  **      eState==PAGER_NONE and eLock==EXCLUSIVE_LOCK.
  **
  **   2. If a connection with locking_mode=exclusive holding an EXCLUSIVE
  **      lock switches back to locking_mode=normal and then executes a
  **      read-transaction, this function is called with eState==PAGER_READER
  **      and eLock==EXCLUSIVE_LOCK when the read-transaction is closed.
  */
  assert( assert_pager_state(pPager) );
  assert( pPager->eState!=PAGER_ERROR );
  if( pPager->eState<PAGER_WRITER_LOCKED && pPager->eLock<RESERVED_LOCK ){
    return SQLITE_OK;
  }

  releaseAllSavepoints(pPager);
  assert( isOpen(pPager->jfd) || pPager->pInJournal==0
      || (sqlite3OsDeviceCharacteristics(pPager->fd)&SQLITE_IOCAP_BATCH_ATOMIC)
  );
  if( isOpen(pPager->jfd) ){
    assert( !pagerUseWal(pPager) );

    /* Finalize the journal file. */
    if( sqlite3JournalIsInMemory(pPager->jfd) ){
      /* assert( pPager->journalMode==PAGER_JOURNALMODE_MEMORY ); */
      sqlite3OsClose(pPager->jfd);
    }else if( pPager->journalMode==PAGER_JOURNALMODE_TRUNCATE ){
      if( pPager->journalOff==0 ){
        rc = SQLITE_OK;
      }else{
        rc = sqlite3OsTruncate(pPager->jfd, 0);
        if( rc==SQLITE_OK && pPager->fullSync ){
          /* Make sure the new file size is written into the inode right away.
          ** Otherwise the journal might resurrect following a power loss and
          ** cause the last transaction to roll back.  See
          ** https://bugzilla.mozilla.org/show_bug.cgi?id=1072773
          */
          rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags);
        }
      }
      pPager->journalOff = 0;
    }else if( pPager->journalMode==PAGER_JOURNALMODE_PERSIST
      || (pPager->exclusiveMode && pPager->journalMode!=PAGER_JOURNALMODE_WAL)
    ){
      rc = zeroJournalHdr(pPager, hasSuper||pPager->tempFile);
      pPager->journalOff = 0;
    }else{
      /* This branch may be executed with Pager.journalMode==MEMORY if
      ** a hot-journal was just rolled back. In this case the journal
      ** file should be closed and deleted. If this connection writes to
      ** the database file, it will do so using an in-memory journal.
      */
      int bDelete = !pPager->tempFile;
      assert( sqlite3JournalIsInMemory(pPager->jfd)==0 );
      assert( pPager->journalMode==PAGER_JOURNALMODE_DELETE
           || pPager->journalMode==PAGER_JOURNALMODE_MEMORY
           || pPager->journalMode==PAGER_JOURNALMODE_WAL
      );
      sqlite3OsClose(pPager->jfd);
      if( bDelete ){
        rc = sqlite3OsDelete(pPager->pVfs, pPager->zJournal, pPager->extraSync);
      }
    }
  }

#ifdef SQLITE_CHECK_PAGES
  sqlite3PcacheIterateDirty(pPager->pPCache, pager_set_pagehash);
  if( pPager->dbSize==0 && sqlite3PcacheRefCount(pPager->pPCache)>0 ){
    PgHdr *p = sqlite3PagerLookup(pPager, 1);
    if( p ){
      p->pageHash = 0;
      sqlite3PagerUnrefNotNull(p);
    }
  }
#endif

  sqlite3BitvecDestroy(pPager->pInJournal);
  pPager->pInJournal = 0;
  pPager->nRec = 0;
  if( rc==SQLITE_OK ){
    if( MEMDB || pagerFlushOnCommit(pPager, bCommit) ){
      sqlite3PcacheCleanAll(pPager->pPCache);
    }else{
      sqlite3PcacheClearWritable(pPager->pPCache);
    }
    sqlite3PcacheTruncate(pPager->pPCache, pPager->dbSize);
  }

  if( pagerUseWal(pPager) ){
    /* Drop the WAL write-lock, if any. Also, if the connection was in
    ** locking_mode=exclusive mode but is no longer, drop the EXCLUSIVE
    ** lock held on the database file.
    */
    rc2 = sqlite3WalEndWriteTransaction(pPager->pWal);
    assert( rc2==SQLITE_OK );
  }else if( rc==SQLITE_OK && bCommit && pPager->dbFileSize>pPager->dbSize ){
    /* This branch is taken when committing a transaction in rollback-journal
    ** mode if the database file on disk is larger than the database image.
    ** At this point the journal has been finalized and the transaction
    ** successfully committed, but the EXCLUSIVE lock is still held on the
    ** file. So it is safe to truncate the database file to its minimum
    ** required size.  */
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    rc = pager_truncate(pPager, pPager->dbSize);
  }

  if( rc==SQLITE_OK && bCommit ){
    rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_COMMIT_PHASETWO, 0);
    if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
  }

  if( !pPager->exclusiveMode
   && (!pagerUseWal(pPager) || sqlite3WalExclusiveMode(pPager->pWal, 0))
  ){
    rc2 = pagerUnlockDb(pPager, SHARED_LOCK);
  }
  pPager->eState = PAGER_READER;
  pPager->setSuper = 0;

  return (rc==SQLITE_OK?rc2:rc);
}